

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_open2.c
# Opt level: O3

void test(int pristine)

{
  longlong v1;
  int iVar1;
  archive *_a;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  wchar_t wVar5;
  
  _a = archive_write_new();
  v1 = -0x19;
  if (pristine == 0) {
    archive_write_add_filter_gzip(_a);
    archive_write_set_format_iso9660(_a);
    v1 = 0;
  }
  iVar1 = archive_write_set_options(_a,(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'-',0,"0",(long)iVar1,"archive_write_set_options(a, ((void*)0))",(void *)0x0
                     );
  iVar1 = archive_write_set_options(_a,"");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'.',0,"0",(long)iVar1,"archive_write_set_options(a, \"\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,"fubar:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'1',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"fubar:snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'3',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"fubar:snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'4',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"fubar:snafu=betcha\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'6',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'9',-0x19,"(-25)",(long)iVar1,"archive_write_set_options(a, \"snafu\")",
                      (void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L';',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'<',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"snafu=betcha\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'>',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"iso9660:joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'A',v1,"known_option_rv",(long)iVar1,
                      "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'F',0,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'D',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'F',-0x19,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'I',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,"joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'K',v1,"known_option_rv",(long)iVar1,
                      "archive_write_set_options(a, \"joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'P',0,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'N',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'P',-0x19,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'S',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,",");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'V',0,"0",(long)iVar1,"archive_write_set_options(a, \",\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",,");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'W',0,"0",(long)iVar1,"archive_write_set_options(a, \",,\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'Y',v1,"halfempty_options_rv",(long)iVar1,
                      "archive_write_set_options(a, \",joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'^',0,"halfempty_options_rv",(long)iVar1,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'\\',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'^',-0x19,"halfempty_options_rv",(long)iVar1,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'a',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,"joliet,snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'd',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"joliet,snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar4 = "Undefined option: `snafu\'";
    pcVar3 = "\"Undefined option: `snafu\'\"";
    wVar5 = L'j';
  }
  else {
    pcVar4 = "Undefined option: `joliet\'";
    pcVar3 = "\"Undefined option: `joliet\'\"";
    wVar5 = L'g';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar5,pcVar4,pcVar3,pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"iso9660:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'm',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"iso9660:snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar4 = "Undefined option: `iso9660:snafu\'";
    pcVar3 = "\"Undefined option: `iso9660:snafu\'\"";
    wVar5 = L's';
  }
  else {
    pcVar4 = "Unknown module name: `iso9660\'";
    pcVar3 = "\"Unknown module name: `iso9660\'\"";
    wVar5 = L'p';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar5,pcVar4,pcVar3,pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_write_free(_a);
  return;
}

Assistant:

static void
test(int formatted, archive_open_callback *o, archive_read_callback *r,
    archive_skip_callback *s, archive_close_callback *c,
    int rv, const char *msg)
{
	struct archive* a = archive_read_new();
	if (formatted)
	    assertEqualInt(ARCHIVE_OK,
		archive_read_support_format_empty(a));
	assertEqualInt(rv,
	    archive_read_open2(a, NULL, o, r, s, c));
	assertEqualString(msg, archive_error_string(a));
	archive_read_free(a);
}